

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O0

void __thiscall libtorrent::dht::find_data_observer::reply(find_data_observer *this,msg *m)

{
  bdecode_node *this_00;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  dht_observer *pdVar4;
  traversal_algorithm *ptVar5;
  find_data *this_01;
  char *s;
  allocator<char> local_161;
  string_view local_160;
  string local_150;
  digest32<160L> local_12c;
  string_view local_118;
  undefined1 local_108 [8];
  bdecode_node token;
  undefined1 local_b8 [8];
  bdecode_node id;
  string_view local_68;
  undefined1 local_58 [8];
  bdecode_node r;
  msg *m_local;
  find_data_observer *this_local;
  
  this_00 = m->message;
  r._56_8_ = m;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"r");
  bdecode_node::dict_find_dict((bdecode_node *)local_58,this_00,local_68);
  bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar1) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&token.m_size,"id");
    bdecode_node::dict_find_string
              ((bdecode_node *)local_b8,(bdecode_node *)local_58,stack0xffffffffffffff38);
    bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_b8);
    if ((bVar1) && (iVar3 = bdecode_node::string_length((bdecode_node *)local_b8), iVar3 == 0x14)) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"token")
      ;
      bdecode_node::dict_find_string((bdecode_node *)local_108,(bdecode_node *)local_58,local_118);
      bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_108);
      if (bVar1) {
        this_01 = (find_data *)observer::algorithm((observer *)this);
        s = bdecode_node::string_ptr((bdecode_node *)local_b8);
        digest32<160L>::digest32(&local_12c,s);
        local_160 = bdecode_node::string_value((bdecode_node *)local_108);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_150,&local_160,&local_161);
        find_data::got_write_token(this_01,&local_12c,&local_150);
        ::std::__cxx11::string::~string((string *)&local_150);
        ::std::allocator<char>::~allocator(&local_161);
      }
      traversal_observer::reply(&this->super_traversal_observer,(msg *)r._56_8_);
      observer::done((observer *)this);
      bdecode_node::~bdecode_node((bdecode_node *)local_108);
      id.m_size = 0;
    }
    else {
      pdVar4 = observer::get_observer((observer *)this);
      ptVar5 = observer::algorithm((observer *)this);
      uVar2 = traversal_algorithm::id(ptVar5);
      (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
                (pdVar4,4,"[%u] invalid id in response",(ulong)uVar2);
      (*(this->super_traversal_observer).super_observer._vptr_observer[3])();
      id.m_size = 1;
    }
    bdecode_node::~bdecode_node((bdecode_node *)local_b8);
  }
  else {
    pdVar4 = observer::get_observer((observer *)this);
    ptVar5 = observer::algorithm((observer *)this);
    uVar2 = traversal_algorithm::id(ptVar5);
    (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
              (pdVar4,4,"[%u] missing response dict",(ulong)uVar2);
    (*(this->super_traversal_observer).super_observer._vptr_observer[3])();
    id.m_size = 1;
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_58);
  return;
}

Assistant:

void find_data_observer::reply(msg const& m)
{
	bdecode_node const r = m.message.dict_find_dict("r");
	if (!r)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] missing response dict"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	bdecode_node const id = r.dict_find_string("id");
	if (!id || id.string_length() != 20)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] invalid id in response"
			, algorithm()->id());
#endif
		timeout();
		return;
	}
	bdecode_node const token = r.dict_find_string("token");
	if (token)
	{
		static_cast<find_data*>(algorithm())->got_write_token(
			node_id(id.string_ptr()), std::string(token.string_value()));
	}

	traversal_observer::reply(m);
	done();
}